

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringFieldGenerator::GenerateSwappingCode
          (StringFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  StringFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->inlined_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "::$proto_ns$::internal::ArenaStringPtr::InternalSwap(\n    $init_value$,\n    &$name$_, lhs_arena,\n    &other->$name$_, rhs_arena\n);\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "$name$_.Swap(&other->$name$_, nullptr, GetArenaForAllocation(), _internal_$name$_donated(), other->_internal_$name$_donated(), &$donating_states_word$, &(other->$donating_states_word$), $mask_for_undonate$);\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void StringFieldGenerator::GenerateSwappingCode(io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (!inlined_) {
    format(
        "::$proto_ns$::internal::ArenaStringPtr::InternalSwap(\n"
        "    $init_value$,\n"
        "    &$name$_, lhs_arena,\n"
        "    &other->$name$_, rhs_arena\n"
        ");\n");
  } else {
    // At this point, it's guaranteed that the two fields being swapped are on
    // the same arena.
    format(
        "$name$_.Swap(&other->$name$_, nullptr, GetArenaForAllocation(), "
        "_internal_$name$_donated(), other->_internal_$name$_donated(), "
        "&$donating_states_word$, &(other->$donating_states_word$), "
        "$mask_for_undonate$);\n");
  }
}